

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::DictionaryTypeHandlerBase<int>::DumpFixedFields(DictionaryTypeHandlerBase<int> *this)

{
  Flags FVar1;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  DictionaryPropertyDescriptor<int> *pDVar2;
  PropertyRecord **ppPVar3;
  int i;
  int index;
  
  for (index = 0; this_00 = (this->propertyMap).ptr, index < this_00->count - this_00->freeCount;
      index = index + 1) {
    pDVar2 = JsUtil::
             BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetValueAt(this_00,index);
    FVar1 = pDVar2->flags;
    ppPVar3 = JsUtil::
              BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetKeyAt((this->propertyMap).ptr,index);
    Output::Print(L" %s %d%d%d,",*ppPVar3 + 1,(ulong)(FVar1 >> 3 & 1),(ulong)(FVar1 >> 5 & 1),
                  (ulong)(FVar1 >> 6 & 1));
  }
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::DumpFixedFields() const {
        for (int i = 0; i < propertyMap->Count(); i++)
        {
            DictionaryPropertyDescriptor<T> descriptor = propertyMap->GetValueAt(i);

            const PropertyRecord* propertyRecord = propertyMap->GetKeyAt(i);
            Output::Print(_u(" %s %d%d%d,"), propertyRecord->GetBuffer(),
                descriptor.GetIsInitialized() ? 1 : 0,
                descriptor.GetIsFixed() ? 1 : 0,
                descriptor.GetUsedAsFixed() ? 1 : 0);
        }
    }